

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

int __thiscall
jaegertracing::net::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  socklen_t __len_00;
  int iVar1;
  sockaddr_storage *__addr_00;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  undefined4 in_register_00000034;
  IPAddress *this_01;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream oss;
  int returnCode;
  IPAddress *addr_local;
  Socket *this_local;
  
  this_01 = (IPAddress *)CONCAT44(in_register_00000034,__fd);
  iVar1 = this->_handle;
  __addr_00 = IPAddress::addr(this_01);
  __len_00 = IPAddress::addrLen(this_01);
  iVar1 = ::bind(iVar1,(sockaddr *)__addr_00,__len_00);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::operator<<((ostream *)local_198,"Failed to bind socket to address, addr=");
    IPAddress::print(this_01,(ostream *)local_198);
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    __ecat = (error_category *)std::_V2::system_category();
    std::__cxx11::ostringstream::str();
    std::system_error::system_error(this_00,iVar1,__ecat,&local_1c8);
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return 0;
}

Assistant:

void bind(const IPAddress& addr)
    {
        const auto returnCode =
            ::bind(_handle,
                   reinterpret_cast<const ::sockaddr*>(&addr.addr()),
                   addr.addrLen());
        if (returnCode != 0) {
            std::ostringstream oss;
            oss << "Failed to bind socket to address"
                   ", addr=";
            addr.print(oss);
            throw std::system_error(errno, std::system_category(), oss.str());
        }
    }